

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doc_comment.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::WriteDocCommentBody<google::protobuf::MethodDescriptor>
          (java *this,Printer *printer,MethodDescriptor *descriptor,Options *options,bool kdoc)

{
  byte bVar1;
  undefined1 local_f0 [96];
  undefined1 local_90 [8];
  SourceLocation location;
  bool kdoc_local;
  Options *options_local;
  MethodDescriptor *descriptor_local;
  Printer *printer_local;
  
  location.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = (byte)options & 1;
  SourceLocation::SourceLocation((SourceLocation *)local_90);
  bVar1 = google::protobuf::MethodDescriptor::GetSourceLocation((SourceLocation *)printer);
  if ((bVar1 & 1) != 0) {
    Options::Options((Options *)local_f0,(Options *)descriptor);
    WriteDocCommentBodyForLocation
              (this,(Printer *)local_90,(SourceLocation *)local_f0,
               (Options *)
               (ulong)(location.leading_detached_comments.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),kdoc);
    Options::~Options((Options *)local_f0);
  }
  SourceLocation::~SourceLocation((SourceLocation *)local_90);
  return;
}

Assistant:

static void WriteDocCommentBody(io::Printer* printer,
                                const DescriptorType* descriptor,
                                const Options options, const bool kdoc) {
  SourceLocation location;
  if (descriptor->GetSourceLocation(&location)) {
    WriteDocCommentBodyForLocation(printer, location, options, kdoc);
  }
}